

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O3

void f8n::env::OpenFile(string *path)

{
  long *plVar1;
  long *plVar2;
  long *__command;
  string command;
  long local_40;
  long lStack_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"xdg-open \'",path);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_30);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_40 = *plVar2;
    lStack_38 = plVar1[3];
    __command = &local_40;
  }
  else {
    local_40 = *plVar2;
    __command = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  system((char *)__command);
  if (__command != &local_40) {
    operator_delete(__command,local_40 + 1);
  }
  return;
}

Assistant:

void OpenFile(const std::string& path) {
    #ifdef WIN32
        ShellExecuteA(nullptr, nullptr, path.c_str(), nullptr, nullptr, SW_SHOWNORMAL);
    #elif __APPLE__
        std::string command = "open '" + path + "' > /dev/null 2> /dev/null";
        system(command.c_str());
    #else
        std::string command = "xdg-open '" + path + "' > /dev/null 2> /dev/null";
        system(command.c_str());
    #endif
    }